

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1TupleType<double,3ul>
          (AsciiParser *this,char sep,
          vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *result)

{
  bool bVar1;
  allocator local_a1;
  string local_a0;
  undefined1 local_80 [8];
  array<double,_3UL> value_1;
  undefined1 local_60 [6];
  char c;
  undefined1 local_40 [8];
  array<double,_3UL> value;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *result_local;
  char sep_local;
  AsciiParser *this_local;
  
  value._M_elems[2] = (double)result;
  ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::clear(result);
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if (bVar1) {
    bVar1 = ParseBasicTypeTuple<double,3ul>(this,(array<double,_3UL> *)local_40);
    if (bVar1) {
      ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::push_back
                ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                 value._M_elems[2],(value_type *)local_40);
      while (bVar1 = Eof(this), ((bVar1 ^ 0xffU) & 1) != 0) {
        bVar1 = SkipWhitespaceAndNewline(this,true);
        if (!bVar1) {
          return false;
        }
        bVar1 = Char1(this,(char *)((long)value_1._M_elems + 0x16));
        if (!bVar1) {
          return false;
        }
        if (value_1._M_elems[2]._6_1_ != sep) {
          StreamReader::seek_from_current(this->_sr,-1);
          break;
        }
        bVar1 = SkipWhitespaceAndNewline(this,true);
        if (!bVar1) {
          return false;
        }
        bVar1 = ParseBasicTypeTuple<double,3ul>(this,(array<double,_3UL> *)local_80);
        if (!bVar1) break;
        ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::push_back
                  ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                   value._M_elems[2],(value_type *)local_80);
      }
      bVar1 = ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
              empty((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                    value._M_elems[2]);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_a0,"Empty array.\n",&local_a1);
        PushError(this,&local_a0);
        ::std::__cxx11::string::~string((string *)&local_a0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_a1);
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)local_60,"Not starting with the tuple value of requested type.\n",
                 (allocator *)((long)value_1._M_elems + 0x17));
      PushError(this,(string *)local_60);
      ::std::__cxx11::string::~string((string *)local_60);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)value_1._M_elems + 0x17));
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::SepBy1TupleType(const char sep,
                                  std::vector<std::array<T, N>> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    std::array<T, N> value;
    if (!ParseBasicTypeTuple<T, N>(&value)) {
      PushError("Not starting with the tuple value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    std::array<T, N> value;
    if (!ParseBasicTypeTuple<T, N>(&value)) {
      break;
    }

    result->push_back(value);
  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}